

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.h
# Opt level: O2

optional<libchess::Color> libchess::Color::from(char c)

{
  ulong uVar1;
  ulong uVar2;
  undefined3 in_register_00000039;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000039,c);
  uVar2 = 0x100000000;
  if (iVar3 != 0x42) {
    uVar1 = 0;
    if ((iVar3 == 0x57) || (iVar3 == 0x77)) goto LAB_00106803;
    if (iVar3 != 0x62) {
      uVar1 = 0;
      uVar2 = 0;
      goto LAB_00106803;
    }
  }
  uVar1 = 1;
LAB_00106803:
  return (optional<libchess::Color>)(uVar1 | uVar2);
}

Assistant:

constexpr static std::optional<Color> from(char c) {
        switch (c) {
        case 'w':
            return Color{Value::WHITE};
        case 'b':
            return Color{Value::BLACK};
        case 'W':
            return Color{Value::WHITE};
        case 'B':
            return Color{Value::BLACK};
        default:
            return {};
        }
    }